

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteBeginBlock
          (WatWriter *this,LabelType label_type,Block *block,char *text)

{
  pointer *ppLVar1;
  TypeVector *types;
  size_type sVar2;
  Label *__last;
  pointer __first;
  _Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
  *this_00;
  pointer __result;
  pointer pLVar3;
  pointer pLVar4;
  _Tp_alloc_type *__alloc;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__s;
  char *__n;
  
  WritePuts(this,text,Space);
  sVar2 = (block->label)._M_string_length;
  if (sVar2 != 0) {
    WritePuts(this,(block->label)._M_dataplus._M_p,Space);
  }
  __alloc = (_Tp_alloc_type *)&(block->decl).sig;
  WriteTypes(this,(TypeVector *)__alloc,"param");
  types = &(block->decl).sig.result_types;
  __n = (char *)types;
  WriteTypes(this,types,"result");
  __s = extraout_RDX;
  if (sVar2 == 0) {
    __n = " ;; label = @%u";
    Writef(this," ;; label = @%u",
           (ulong)(uint)((int)((ulong)((long)(this->label_stack_).
                                             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->label_stack_).
                                            super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x45d1745d));
    __s = extraout_RDX_00;
  }
  if (this->next_char_ == ForceNewline) {
    WriteNextChar(this);
    __s = extraout_RDX_01;
  }
  this->next_char_ = ForceNewline;
  __last = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__last == (this->label_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = (_Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               *)std::
                 vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
                 ::_M_check_len(&this->label_stack_,(size_type)__n,__s);
    __first = (this->label_stack_).
              super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __result = std::
               _Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               ::_M_allocate(this_00,(size_t)__n);
    Label::Label((Label *)(((long)__last - (long)__first) + (long)__result),label_type,&block->label
                 ,(TypeVector *)__alloc,types);
    pLVar3 = std::
             vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ::_S_relocate(__first,__last,__result,__alloc);
    pLVar4 = std::
             vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ::_S_relocate(__last,pLVar4,pLVar3 + 1,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first);
    }
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar4;
    (this->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
  }
  else {
    Label::Label(__last,label_type,&block->label,(TypeVector *)__alloc,types);
    ppLVar1 = &(this->label_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
  this->indent_ = this->indent_ + 2;
  return;
}

Assistant:

void WatWriter::WriteBeginBlock(LabelType label_type,
                                const Block& block,
                                const char* text) {
  WritePutsSpace(text);
  bool has_label = !block.label.empty();
  if (has_label) {
    WriteString(block.label, NextChar::Space);
  }
  WriteTypes(block.decl.sig.param_types, "param");
  WriteTypes(block.decl.sig.result_types, "result");
  if (!has_label) {
    Writef(" ;; label = @%" PRIindex, GetLabelStackSize());
  }
  WriteNewline(FORCE_NEWLINE);
  label_stack_.emplace_back(label_type, block.label, block.decl.sig.param_types,
                            block.decl.sig.result_types);
  Indent();
}